

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

shared_ptr<cppcms::session_api> __thiscall
cppcms::session_pool::dual_factory::get(dual_factory *this)

{
  pointer psVar1;
  pointer peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  session_dual *in_RDI;
  shared_ptr<cppcms::session_api> sVar4;
  size_t in_stack_00000018;
  shared_ptr<cppcms::sessions::session_storage> *in_stack_00000020;
  unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
  *in_stack_00000028;
  session_dual *in_stack_00000030;
  shared_ptr<cppcms::session_api> *p;
  session_dual *__p;
  undefined1 local_40 [16];
  undefined1 local_30 [31];
  undefined1 local_11;
  
  local_11 = 0;
  __p = in_RDI;
  std::shared_ptr<cppcms::session_api>::shared_ptr((shared_ptr<cppcms::session_api> *)0x43484f);
  psVar1 = std::
           unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
           ::get((unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
                  *)in_RDI);
  _Var3._M_pi = extraout_RDX;
  if ((psVar1 != (pointer)0x0) &&
     (peVar2 = std::
               unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
               ::get((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
                      *)in_RDI), _Var3._M_pi = extraout_RDX_00, peVar2 != (pointer)0x0)) {
    operator_new(0x38);
    peVar2 = std::
             unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
             ::operator->((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
                           *)0x4348ae);
    (**peVar2->_vptr_encryptor_factory)(local_30);
    psVar1 = std::
             unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
             ::operator->((unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
                           *)0x4348d2);
    (**psVar1->_vptr_session_storage_factory)(local_40);
    sessions::session_dual::session_dual
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    std::__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_dual>(in_RSI,__p);
    std::shared_ptr<cppcms::sessions::session_storage>::~shared_ptr
              ((shared_ptr<cppcms::sessions::session_storage> *)0x434922);
    std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
    ::~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_RSI);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &__p->super_session_api;
  return (shared_ptr<cppcms::session_api>)
         sVar4.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<session_api> get() 
	{
		booster::shared_ptr<session_api> p;
		if(pool_->storage_.get() && pool_->encryptor_.get())
			p.reset(new session_dual(pool_->encryptor_->get(),pool_->storage_->get(),limit_));
		return p;
	}